

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_point.cpp
# Opt level: O0

lua_State * __thiscall ExtensionPoint::QueryParentThread(ExtensionPoint *this,lua_State *L)

{
  int iVar1;
  int iVar2;
  char *name;
  int r;
  int t;
  lua_State *PL;
  lua_State *L_local;
  ExtensionPoint *this_local;
  
  _r = (lua_State *)0x0;
  iVar1 = (*lua_gettop)(L);
  name = (char *)std::__cxx11::string::c_str();
  lua_getglobal(L,name);
  iVar2 = (*lua_type)(L,-1);
  if (iVar2 == 5) {
    (*lua_getfield)(L,-1,"queryParentThread");
    iVar2 = (*lua_type)(L,-1);
    if ((iVar2 == 6) && (iVar2 = lua_pcall(L,0,1,0), iVar2 == 0)) {
      _r = (*lua_tothread)(L,-1);
    }
  }
  (*lua_settop)(L,iVar1);
  return _r;
}

Assistant:

lua_State* ExtensionPoint::QueryParentThread(lua_State* L)
{
	lua_State* PL = nullptr;
	const int t = lua_gettop(L);
	lua_getglobal(L, ExtensionTable.c_str());
	if (lua_istable(L, -1))
	{
		lua_getfield(L, -1, "queryParentThread");
		if (lua_isfunction(L, -1))
		{
			const auto r = lua_pcall(L, 0, 1, 0);
			if (r == LUA_OK)
			{
				PL = lua_tothread(L, -1);
			}
		}
	}
	lua_settop(L, t);

	return PL;
}